

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O3

void process_statement_list(CompilerState *compiler_state,AstNodeList *list)

{
  anon_union_72_25_595a31af_for_AstNode_2 *paVar1;
  byte *pbVar2;
  LuaSymbolList **list_00;
  _Bool *p_Var3;
  AstNodeList **self;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  AstNode *pAVar7;
  Scope *pSVar8;
  StringObject *pSVar9;
  LuaSymbolList *pLVar10;
  AstNode *pAVar11;
  AstNode *pAVar12;
  AstNodeList *pAVar13;
  AstNode *pAVar14;
  long lVar15;
  CompilerState *compiler_state_00;
  uint *puVar16;
  byte bVar17;
  char s [8];
  char f [8];
  PtrListIterator nodeiter__;
  PtrListIterator PStack_f0;
  CompilerState *pCStack_d8;
  AstNode *pAStack_d0;
  AstNode *local_c0;
  anon_union_72_25_595a31af_for_AstNode_2 *local_b8;
  AstNode *local_b0;
  anon_union_72_25_595a31af_for_AstNode_2 *local_a8;
  AstNode *local_a0;
  Scope *local_98;
  AstNode *local_90;
  AstNode *local_88;
  AstNode *local_80;
  AstNodeList *local_78;
  undefined8 local_70;
  undefined8 local_68;
  PtrListIterator local_60;
  
  bVar17 = 0;
  pAVar14 = (AstNode *)&stack0xffffffffffffffb8;
  pAStack_d0 = (AstNode *)0x10ae07;
  raviX_ptrlist_forward_iterator((PtrListIterator *)pAVar14,(PtrList *)list);
  pAStack_d0 = (AstNode *)0x10ae0f;
  puVar6 = (uint *)raviX_ptrlist_iter_next((PtrListIterator *)pAVar14);
joined_r0x0010ae12:
  if (puVar6 == (uint *)0x0) {
    return;
  }
  compiler_state_00 = (CompilerState *)(ulong)*puVar6;
  switch(compiler_state_00) {
  case (CompilerState *)0x0:
  case (CompilerState *)0x2:
  case (CompilerState *)0x3:
  case (CompilerState *)0xe:
    break;
  case (CompilerState *)0x1:
    list = *(AstNodeList **)(puVar6 + 2);
    goto LAB_0010b543;
  case (CompilerState *)0x4:
    list = *(AstNodeList **)(puVar6 + 4);
    goto LAB_0010b561;
  case (CompilerState *)0x5:
    goto switchD_0010ae44_caseD_5;
  case (CompilerState *)0x6:
    list = *(AstNodeList **)(puVar6 + 8);
    goto LAB_0010b552;
  case (CompilerState *)0x7:
    list = *(AstNodeList **)(puVar6 + 2);
    pAStack_d0 = (AstNode *)0x10b4e5;
    raviX_ptrlist_forward_iterator(&local_60,(PtrList *)list);
    pAStack_d0 = (AstNode *)0x10b4ed;
    pAVar7 = (AstNode *)raviX_ptrlist_iter_next(&local_60);
    while (pAVar7 != (AstNode *)0x0) {
      pAStack_d0 = (AstNode *)0x10b501;
      process_expression(compiler_state,(AstNode *)(pAVar7->field_2).function_stmt.name);
      list = *(AstNodeList **)((long)&pAVar7->field_2 + 0x10);
      pAStack_d0 = (AstNode *)0x10b50d;
      process_statement_list(compiler_state,list);
      pAStack_d0 = (AstNode *)0x10b515;
      pAVar7 = (AstNode *)raviX_ptrlist_iter_next(&local_60);
      pAVar14 = pAVar7;
    }
    if (*(long *)(puVar6 + 4) != 0) goto LAB_0010b525;
    break;
  default:
    pAStack_d0 = (AstNode *)process_expression_list;
    process_statement_list_cold_1();
    pCStack_d8 = compiler_state;
    pAStack_d0 = pAVar14;
    raviX_ptrlist_forward_iterator(&PStack_f0,(PtrList *)list);
    pAVar14 = (AstNode *)raviX_ptrlist_iter_next(&PStack_f0);
    while (pAVar14 != (AstNode *)0x0) {
      process_expression(compiler_state_00,pAVar14);
      pAVar14 = (AstNode *)raviX_ptrlist_iter_next(&PStack_f0);
    }
    return;
  case (CompilerState *)0x9:
    pAStack_d0 = (AstNode *)0x10ae74;
    process_expression(compiler_state,*(AstNode **)(puVar6 + 2));
LAB_0010b525:
    list = *(AstNodeList **)(puVar6 + 6);
    goto LAB_0010b561;
  case (CompilerState *)0xa:
    pSVar8 = *(Scope **)(puVar6 + 2);
    pAVar14 = pSVar8->function;
    local_78 = *(AstNodeList **)(puVar6 + 8);
    pAStack_d0 = (AstNode *)0x10aec1;
    local_98 = pSVar8;
    local_88 = pAVar14;
    pAVar7 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,puVar6[1]);
    local_b8 = (anon_union_72_25_595a31af_for_AstNode_2 *)((long)&pAVar7->field_2 + 8);
    (pAVar7->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10aee7;
    local_80 = pAVar7;
    pSVar8 = raviX_allocate_scope(compiler_state,pAVar14,pSVar8->parent);
    (pAVar7->field_2).do_stmt.scope = pSVar8;
    local_68 = 0x29665f726f6628;
    local_70 = 0x29735f726f6628;
    local_60.__head = (PtrList *)0x7261765f726f6628;
    local_60.__list._0_2_ = 0x29;
    pAStack_d0 = (AstNode *)0x10af37;
    local_b0 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,puVar6[1]);
    paVar1 = &local_b0->field_2;
    (local_b0->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
    (local_b0->field_2).goto_stmt.name = *(StringObject **)(puVar6 + 6);
    pAStack_d0 = (AstNode *)0x10af66;
    local_a8 = paVar1;
    pSVar9 = raviX_create_string(compiler_state,(char *)&local_68,7);
    pAStack_d0 = (AstNode *)0x10af7c;
    local_c0 = (AstNode *)
               raviX_new_local_symbol(compiler_state,pSVar8,pSVar9,RAVI_TANY,(StringObject *)0x0);
    pAStack_d0 = (AstNode *)0x10af93;
    pSVar9 = raviX_create_string(compiler_state,(char *)&local_70,7);
    pAStack_d0 = (AstNode *)0x10afa9;
    pAVar7 = (AstNode *)
             raviX_new_local_symbol(compiler_state,pSVar8,pSVar9,RAVI_TANY,(StringObject *)0x0);
    pAStack_d0 = (AstNode *)0x10afc1;
    local_90 = pAVar7;
    pSVar9 = raviX_create_string(compiler_state,(char *)&local_60,9);
    pAStack_d0 = (AstNode *)0x10afd7;
    local_a0 = (AstNode *)
               raviX_new_local_symbol(compiler_state,pSVar8,pSVar9,RAVI_TANY,(StringObject *)0x0);
    pAVar14 = local_c0;
    pbVar2 = (byte *)((long)&local_c0->field_2 + 0x28);
    *pbVar2 = *pbVar2 | 4;
    pbVar2 = (byte *)((long)&pAVar7->field_2 + 0x28);
    *pbVar2 = *pbVar2 | 4;
    pbVar2 = (byte *)((long)&local_a0->field_2 + 0x28);
    *pbVar2 = *pbVar2 | 4;
    pAStack_d0 = (AstNode *)0x10affc;
    raviX_add_symbol(compiler_state,(LuaSymbolList **)&paVar1->return_stmt,(LuaSymbol *)local_c0);
    list_00 = &pSVar8->symbol_list;
    pAStack_d0 = (AstNode *)0x10b00e;
    raviX_add_symbol(compiler_state,list_00,(LuaSymbol *)pAVar14);
    paVar1 = local_a8;
    pAStack_d0 = (AstNode *)0x10b021;
    raviX_add_symbol(compiler_state,(LuaSymbolList **)&local_a8->return_stmt,(LuaSymbol *)pAVar7);
    pAStack_d0 = (AstNode *)0x10b02f;
    raviX_add_symbol(compiler_state,list_00,(LuaSymbol *)pAVar7);
    pAVar14 = local_a0;
    pAStack_d0 = (AstNode *)0x10b042;
    raviX_add_symbol(compiler_state,(LuaSymbolList **)&paVar1->return_stmt,(LuaSymbol *)local_a0);
    pAStack_d0 = (AstNode *)0x10b050;
    raviX_add_symbol(compiler_state,list_00,(LuaSymbol *)pAVar14);
    paVar1 = local_b8;
    pAStack_d0 = (AstNode *)0x10b065;
    raviX_ptrlist_add((PtrList **)local_b8,local_b0,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b077;
    pAVar14 = raviX_allocate_ast_node_at_line(compiler_state,STMT_WHILE,puVar6[1]);
    local_98->parent = pSVar8;
    (pAVar14->field_2).test_then_block.test_then_scope = local_98;
    local_b0 = (AstNode *)((long)&pAVar14->field_2 + 0x10);
    (pAVar14->field_2).goto_stmt.goto_scope = (Scope *)0x0;
    pAStack_d0 = (AstNode *)0x10b0a6;
    pLVar10 = (LuaSymbolList *)raviX_allocate_ast_node_at_line(compiler_state,EXPR_LITERAL,0);
    *(byte *)&pLVar10->allocator_ = *(byte *)&pLVar10->allocator_ & 0xfe;
    *(undefined4 *)&pLVar10->prev_ = 7;
    pLVar10->next_ = (LuaSymbolList *)0x0;
    pLVar10->list_[0] = (LuaSymbol *)0x1;
    (pAVar14->field_2).local_stmt.var_list = pLVar10;
    pAStack_d0 = (AstNode *)0x10b0d2;
    raviX_ptrlist_add((PtrList **)paVar1,pAVar14,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b0e4;
    pAVar14 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,puVar6[1]);
    (pAVar14->field_2).return_stmt.expr_list = *(AstNodeList **)(puVar6 + 4);
    local_b8 = (anon_union_72_25_595a31af_for_AstNode_2 *)((long)&pAVar14->field_2 + 8);
    (pAVar14->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10b107;
    iVar5 = raviX_ptrlist_size(*(PtrList **)(puVar6 + 4));
    local_a8 = (anon_union_72_25_595a31af_for_AstNode_2 *)CONCAT44(local_a8._4_4_,iVar5);
    pAStack_d0 = (AstNode *)0x10b11a;
    pAVar7 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SUFFIXED,0);
    p_Var3 = &(pAVar7->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar7->field_2).common_expr.type.type_code = RAVI_TANY;
    pAStack_d0 = (AstNode *)0x10b13a;
    pAVar11 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar11->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar11->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar9 = (local_c0->field_2).goto_stmt.name;
    (pAVar11->field_2).return_stmt.expr_list = (local_c0->field_2).return_stmt.expr_list;
    (pAVar11->field_2).goto_stmt.name = pSVar9;
    (pAVar11->field_2).function_stmt.function_expr = local_c0;
    (pAVar7->field_2).function_stmt.function_expr = pAVar11;
    (pAVar7->field_2).common_expr.type.type_code = RAVI_TANY;
    (pAVar7->field_2).goto_stmt.name = (StringObject *)0x0;
    local_c0 = (AstNode *)((long)&pAVar7->field_2 + 0x20);
    (pAVar7->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
    pAStack_d0 = (AstNode *)0x10b17d;
    pAVar11 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_FUNCTION_CALL,0);
    p_Var3 = &(pAVar11->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    self = &(pAVar11->field_2).for_stmt.for_statement_list;
    (pAVar11->field_2).function_stmt.function_expr = (AstNode *)0x0;
    (pAVar11->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
    (pAVar11->field_2).function_call_expr.num_results = (int)local_a8;
    (pAVar11->field_2).common_expr.type.type_code = RAVI_TANY;
    (pAVar11->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10b1b5;
    pAVar12 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar12->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar12->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar8 = (Scope *)(local_90->field_2).goto_stmt.name;
    (pAVar12->field_2).return_stmt.expr_list = (local_90->field_2).return_stmt.expr_list;
    (pAVar12->field_2).goto_stmt.name = (StringObject *)pSVar8;
    (pAVar12->field_2).function_stmt.function_expr = local_90;
    pAStack_d0 = (AstNode *)0x10b1e0;
    raviX_ptrlist_add((PtrList **)self,pAVar12,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b1ef;
    pAVar12 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar12->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar12->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar9 = (local_a0->field_2).goto_stmt.name;
    (pAVar12->field_2).return_stmt.expr_list = (local_a0->field_2).return_stmt.expr_list;
    (pAVar12->field_2).goto_stmt.name = pSVar9;
    (pAVar12->field_2).function_stmt.function_expr = local_a0;
    pAStack_d0 = (AstNode *)0x10b21a;
    raviX_ptrlist_add((PtrList **)self,pAVar12,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b22a;
    raviX_ptrlist_add((PtrList **)local_c0,pAVar11,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b23a;
    raviX_ptrlist_add((PtrList **)local_b8,pAVar7,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b24a;
    raviX_ptrlist_add((PtrList **)local_b0,pAVar14,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b254;
    pSVar8 = (Scope *)raviX_ptrlist_first(*(PtrList **)(puVar6 + 4));
    pAStack_d0 = (AstNode *)0x10b269;
    local_c0 = raviX_allocate_ast_node_at_line(compiler_state,STMT_IF,puVar6[1]);
    local_b8 = &local_c0->field_2;
    (local_c0->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
    (local_c0->field_2).goto_stmt.name = (StringObject *)0x0;
    (local_c0->field_2).goto_stmt.goto_scope = (Scope *)0x0;
    pAStack_d0 = (AstNode *)0x10b296;
    pAVar14 = raviX_allocate_ast_node_at_line(compiler_state,STMT_TEST_THEN,puVar6[1]);
    pAStack_d0 = (AstNode *)0x10b2a8;
    pAVar13 = (AstNodeList *)raviX_allocate_ast_node_at_line(compiler_state,EXPR_BINARY,0);
    *(byte *)&pAVar13->allocator_ = *(byte *)&pAVar13->allocator_ & 0xfe;
    *(undefined4 *)&pAVar13->prev_ = 0xffffffff;
    pAStack_d0 = (AstNode *)0x10b2c8;
    pAVar7 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar7->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar7->field_2).common_expr.type.type_code = RAVI_TANY;
    pLVar10 = pSVar8->symbol_list;
    (pAVar7->field_2).return_stmt.expr_list = (AstNodeList *)pSVar8->parent;
    (pAVar7->field_2).goto_stmt.name = (StringObject *)pLVar10;
    (pAVar7->field_2).for_stmt.for_body = pSVar8;
    pAVar13->list_[0] = pAVar7;
    pAStack_d0 = (AstNode *)0x10b2ef;
    pAVar7 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_LITERAL,0);
    p_Var3 = &(pAVar7->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar7->field_2).common_expr.type.type_code = RAVI_TNIL;
    (pAVar7->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar7->field_2).function_stmt.function_expr = (AstNode *)0x0;
    pAVar13->list_[1] = pAVar7;
    *(undefined4 *)((long)&pAVar13->allocator_ + 4) = 0xd;
    (pAVar14->field_2).expression_stmt.var_expr_list = pAVar13;
    (pAVar14->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar14->field_2).goto_stmt.goto_scope = (Scope *)0x0;
    pAStack_d0 = (AstNode *)0x10b332;
    pSVar8 = raviX_allocate_scope(compiler_state,local_88,local_98);
    (pAVar14->field_2).test_then_block.test_then_scope = pSVar8;
    pAStack_d0 = (AstNode *)0x10b34d;
    pSVar9 = raviX_create_string(compiler_state,"break",6);
    pAStack_d0 = (AstNode *)0x10b35f;
    pAVar7 = raviX_allocate_ast_node_at_line(compiler_state,STMT_GOTO,0);
    (pAVar7->field_2).goto_stmt.name = pSVar9;
    *(byte *)&pAVar7->field_2 = *(byte *)&pAVar7->field_2 | 1;
    (pAVar7->field_2).goto_stmt.goto_scope = pSVar8;
    pAStack_d0 = (AstNode *)0x10b379;
    raviX_ptrlist_add((PtrList **)&(pAVar14->field_2).goto_stmt.goto_scope,pAVar7,
                      compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b389;
    raviX_ptrlist_add((PtrList **)&local_b8->return_stmt,pAVar14,compiler_state->allocator);
    pAVar7 = local_b0;
    pAStack_d0 = (AstNode *)0x10b39e;
    raviX_ptrlist_add((PtrList **)local_b0,local_c0,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b3b0;
    pAVar14 = raviX_allocate_ast_node_at_line(compiler_state,STMT_EXPR,puVar6[1]);
    (pAVar14->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
    (pAVar14->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10b3d1;
    pAVar11 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar11->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar11->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar9 = (local_a0->field_2).goto_stmt.name;
    (pAVar11->field_2).return_stmt.expr_list = (local_a0->field_2).return_stmt.expr_list;
    (pAVar11->field_2).goto_stmt.name = pSVar9;
    (pAVar11->field_2).function_stmt.function_expr = local_a0;
    pAStack_d0 = (AstNode *)0x10b3fc;
    raviX_ptrlist_add((PtrList **)&(pAVar14->field_2).return_stmt,pAVar11,compiler_state->allocator)
    ;
    pAStack_d0 = (AstNode *)0x10b406;
    pSVar8 = (Scope *)raviX_ptrlist_first(*(PtrList **)(puVar6 + 4));
    pAStack_d0 = (AstNode *)0x10b418;
    pAVar11 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar11->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar11->field_2).common_expr.type.type_code = RAVI_TANY;
    pLVar10 = pSVar8->symbol_list;
    (pAVar11->field_2).return_stmt.expr_list = (AstNodeList *)pSVar8->parent;
    (pAVar11->field_2).goto_stmt.name = (StringObject *)pLVar10;
    (pAVar11->field_2).for_stmt.for_body = pSVar8;
    pAStack_d0 = (AstNode *)0x10b43f;
    raviX_ptrlist_add((PtrList **)&(pAVar14->field_2).goto_stmt.name,pAVar11,
                      compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b44d;
    raviX_ptrlist_add((PtrList **)pAVar7,pAVar14,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b45f;
    pAVar14 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,puVar6[1]);
    (pAVar14->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar14->field_2).return_stmt.expr_list = local_78;
    pAStack_d0 = (AstNode *)0x10b480;
    raviX_ptrlist_add((PtrList **)pAVar7,pAVar14,compiler_state->allocator);
    (pAVar14->field_2).goto_stmt.name = *(StringObject **)(puVar6 + 10);
    puVar6[2] = 0;
    puVar6[3] = 0;
    puVar6[8] = 0;
    puVar6[9] = 0;
    puVar6[10] = 0;
    puVar6[0xb] = 0;
    pAVar7 = local_80;
    puVar16 = puVar6;
    for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
      uVar4 = pAVar7->line_number;
      puVar16[0] = pAVar7->type;
      puVar16[1] = uVar4;
      pAVar7 = (AstNode *)((long)pAVar7 + (ulong)bVar17 * -0x10 + 8);
      puVar16 = puVar16 + (ulong)bVar17 * -4 + 2;
    }
    if (*puVar6 != 4) {
      pAStack_d0 = (AstNode *)0x10b5ae;
      __assert_fail("node->type == STMT_DO",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_lower.c"
                    ,400,"void process_statement(CompilerState *, AstNode *)");
    }
    list = *(AstNodeList **)(puVar6 + 4);
    pAStack_d0 = (AstNode *)0x10b4bf;
    process_statement_list(compiler_state,list);
    break;
  case (CompilerState *)0xb:
    pAStack_d0 = (AstNode *)0x10ae5d;
    process_expression_list(compiler_state,*(AstNodeList **)(puVar6 + 6));
    list = *(AstNodeList **)(puVar6 + 10);
LAB_0010b561:
    pAStack_d0 = (AstNode *)0x10b569;
    process_statement_list(compiler_state,list);
    break;
  case (CompilerState *)0xc:
    pAStack_d0 = (AstNode *)0x10ae86;
    process_statement_list(compiler_state,*(AstNodeList **)(puVar6 + 6));
    list = *(AstNodeList **)(puVar6 + 2);
LAB_0010b552:
    pAStack_d0 = (AstNode *)0x10b55a;
    process_expression(compiler_state,(AstNode *)list);
    break;
  case (CompilerState *)0xd:
    if (*(AstNodeList **)(puVar6 + 2) != (AstNodeList *)0x0) {
      pAStack_d0 = (AstNode *)0x10b53e;
      process_expression_list(compiler_state,*(AstNodeList **)(puVar6 + 2));
    }
    goto switchD_0010ae44_caseD_5;
  }
switchD_0010ae44_caseD_0:
  pAStack_d0 = (AstNode *)0x10b571;
  puVar6 = (uint *)raviX_ptrlist_iter_next((PtrListIterator *)&stack0xffffffffffffffb8);
  goto joined_r0x0010ae12;
switchD_0010ae44_caseD_5:
  list = *(AstNodeList **)(puVar6 + 4);
LAB_0010b543:
  pAStack_d0 = (AstNode *)0x10b54b;
  process_expression_list(compiler_state,list);
  goto switchD_0010ae44_caseD_0;
}

Assistant:

static void process_statement_list(CompilerState *compiler_state, AstNodeList *list)
{
	AstNode *node;
	FOR_EACH_PTR(list, AstNode, node) { process_statement(compiler_state, node); }
	END_FOR_EACH_PTR(node);
}